

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_thread.c
# Opt level: O0

void ares_event_thread_destroy_int(ares_event_thread_t *e)

{
  void *local_18;
  void *rv;
  ares_event_thread_t *e_local;
  
  rv = e;
  ares_thread_mutex_lock(e->mutex);
  if (*rv != 0) {
    *(undefined4 *)rv = 0;
    ares_event_thread_wake((ares_event_thread_t *)rv);
  }
  ares_thread_mutex_unlock(*(ares_thread_mutex_t **)((long)rv + 0x10));
  if (*(long *)((long)rv + 8) != 0) {
    local_18 = (void *)0x0;
    ares_thread_join(*(ares_thread_t **)((long)rv + 8),&local_18);
    *(undefined8 *)((long)rv + 8) = 0;
  }
  ares_event_thread_cleanup((ares_event_thread_t *)rv);
  ares_thread_mutex_destroy(*(ares_thread_mutex_t **)((long)rv + 0x10));
  *(undefined8 *)((long)rv + 0x10) = 0;
  ares_free(rv);
  return;
}

Assistant:

static void ares_event_thread_destroy_int(ares_event_thread_t *e)
{
  /* Wake thread and tell it to shutdown if it exists */
  ares_thread_mutex_lock(e->mutex);
  if (e->isup) {
    e->isup = ARES_FALSE;
    ares_event_thread_wake(e);
  }
  ares_thread_mutex_unlock(e->mutex);

  /* Wait for thread to shutdown */
  if (e->thread) {
    void *rv = NULL;
    ares_thread_join(e->thread, &rv);
    e->thread = NULL;
  }

  /* If the event thread ever got to the point of starting, this is a no-op
   * as it runs this same cleanup when it shuts down */
  ares_event_thread_cleanup(e);

  ares_thread_mutex_destroy(e->mutex);
  e->mutex = NULL;

  ares_free(e);
}